

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O3

Float __thiscall pbrt::Curve::Area(Curve *this)

{
  Float FVar1;
  float fVar2;
  float fVar3;
  ulong uVar4;
  long lVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  span<const_pbrt::Point3<float>_> cp;
  array<pbrt::Point3<float>,_4> cpObj;
  ulong uStack_48;
  array<pbrt::Point3<float>,_4> local_40;
  
  cp.ptr = this->common->cpObj;
  cp.n = 4;
  CubicBezierControlPoints(&local_40,cp,this->uMin,this->uMax);
  uVar4._0_4_ = this->uMin;
  uVar4._4_4_ = this->uMax;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar4;
  auVar11._8_8_ = 0;
  auVar11._0_4_ = local_40.values[0].super_Tuple3<pbrt::Point3,_float>.x;
  auVar11._4_4_ = local_40.values[0].super_Tuple3<pbrt::Point3,_float>.y;
  fVar6 = 0.0;
  FVar1 = this->common->width[0];
  fVar2 = this->common->width[1];
  lVar5 = 0x14;
  do {
    auVar13._8_8_ = 0;
    auVar13._0_8_ = *(ulong *)((long)&uStack_48 + lVar5);
    fVar3 = *(float *)((long)&local_40.values[0].super_Tuple3<pbrt::Point3,_float>.x + lVar5);
    lVar5 = lVar5 + 0xc;
    auVar11 = vsubps_avx(auVar11,auVar13);
    local_40.values[0].super_Tuple3<pbrt::Point3,_float>.z =
         local_40.values[0].super_Tuple3<pbrt::Point3,_float>.z - fVar3;
    auVar10._0_4_ = auVar11._0_4_ * auVar11._0_4_;
    auVar10._4_4_ = auVar11._4_4_ * auVar11._4_4_;
    auVar10._8_4_ = auVar11._8_4_ * auVar11._8_4_;
    auVar10._12_4_ = auVar11._12_4_ * auVar11._12_4_;
    auVar11 = vhaddps_avx(auVar10,auVar10);
    auVar11 = ZEXT416((uint)(auVar11._0_4_ +
                            local_40.values[0].super_Tuple3<pbrt::Point3,_float>.z *
                            local_40.values[0].super_Tuple3<pbrt::Point3,_float>.z));
    auVar11 = vsqrtss_avx(auVar11,auVar11);
    fVar6 = fVar6 + auVar11._0_4_;
    local_40.values[0].super_Tuple3<pbrt::Point3,_float>.z = fVar3;
    auVar11 = auVar13;
  } while (lVar5 != 0x38);
  auVar12._8_4_ = 0x3f800000;
  auVar12._0_8_ = 0x3f8000003f800000;
  auVar12._12_4_ = 0x3f800000;
  auVar7._4_4_ = FVar1;
  auVar7._0_4_ = FVar1;
  auVar7._8_4_ = FVar1;
  auVar7._12_4_ = FVar1;
  auVar8._0_4_ = fVar2 * (float)(undefined4)uVar4;
  auVar8._4_4_ = fVar2 * (float)uVar4._4_4_;
  auVar8._8_4_ = fVar2 * 0.0;
  auVar8._12_4_ = fVar2 * 0.0;
  auVar11 = vsubps_avx(auVar12,auVar9);
  auVar11 = vfmadd213ps_fma(auVar7,auVar11,auVar8);
  auVar11 = vhaddps_avx(auVar11,auVar11);
  return auVar11._0_4_ * 0.5 * fVar6;
}

Assistant:

Float Curve::Area() const {
    pstd::array<Point3f, 4> cpObj =
        CubicBezierControlPoints(pstd::MakeConstSpan(common->cpObj), uMin, uMax);
    Float width0 = Lerp(uMin, common->width[0], common->width[1]);
    Float width1 = Lerp(uMax, common->width[0], common->width[1]);
    Float avgWidth = (width0 + width1) * 0.5f;
    Float approxLength = 0.f;
    for (int i = 0; i < 3; ++i)
        approxLength += Distance(cpObj[i], cpObj[i + 1]);
    return approxLength * avgWidth;
}